

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O3

int PVSearch(Situation *situation,int depth,int alpha,int beta,Movement *inspire)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar5;
  undefined4 uVar7;
  Movement move_00;
  Movement hash_move;
  Movement move_01;
  Movement move_02;
  Movement move_03;
  bool bVar8;
  int iVar9;
  clock_t cVar10;
  long lVar11;
  int iVar12;
  Movement *all_movements;
  Movement move;
  Movement inspire_move;
  Movement good_move;
  int move_num;
  Movement move_list [128];
  int local_698;
  int local_694;
  Movement local_690;
  int local_684;
  ulong local_680;
  Situation *local_678;
  uint local_670;
  int local_66c;
  Movement local_668;
  Movement local_658;
  int local_64c;
  ulong local_648;
  Movement *local_640;
  Movement local_638 [128];
  undefined6 uVar4;
  undefined5 uVar6;
  
  local_668.catc = '\0';
  local_668.movec = '\0';
  local_668._10_2_ = 0;
  local_668.from = '\0';
  local_668.to = '\0';
  local_668.capture = '\0';
  local_668._3_1_ = 0;
  local_668.value = 0;
  local_658.from = '\0';
  local_658.to = '\0';
  local_658.capture = '\0';
  local_658._3_1_ = 0;
  local_658.value = 0;
  local_658.catc = '\0';
  local_658.movec = '\0';
  local_658._10_2_ = 0;
  local_690.from = '\0';
  local_690.to = '\0';
  local_690.capture = '\0';
  local_690._3_1_ = 0;
  local_690.value = 0;
  local_690.catc = '\0';
  local_690.movec = '\0';
  local_690._10_2_ = 0;
  if (depth < 1) {
    iVar9 = QuiescentSearch(situation,alpha,beta);
    return iVar9;
  }
  iVar9 = beta;
  if (step + -10000 < beta) {
    iVar9 = ReadHashTable(depth,alpha,beta,&local_690);
    if (iVar9 < -9999 || iVar9 == 0x100000) {
      local_678 = situation;
      if ((2 < (uint)depth) &&
         (move_00.to = local_690.to, move_00.from = local_690.from,
         move_00.capture = local_690.capture, move_00._3_1_ = local_690._3_1_,
         move_00.value = local_690.value, move_00.catc = local_690.catc,
         move_00.movec = local_690.movec, move_00._10_2_ = local_690._10_2_,
         bVar8 = MovementsLegal(move_00,situation), !bVar8)) {
        iVar9 = PVSearch(situation,(uint)depth >> 1,alpha,beta,&local_668);
        if (iVar9 <= alpha) {
          PVSearch(local_678,(uint)depth >> 1,-0x100000,beta,&local_668);
        }
        local_690.catc = local_668.catc;
        local_690.movec = local_668.movec;
        local_690._10_2_ = local_668._10_2_;
        local_690.from = local_668.from;
        local_690.to = local_668.to;
        local_690._2_6_ = local_668._2_6_;
        situation = local_678;
      }
      if ((isTimeLimit == false) && (cVar10 = clock(), cVar10 - StartTime < 0x9c41)) {
        local_64c = 0;
        hash_move.to = local_690.to;
        hash_move.from = local_690.from;
        hash_move.capture = local_690.capture;
        hash_move._3_1_ = local_690._3_1_;
        hash_move.value = local_690.value;
        hash_move.catc = local_690.catc;
        hash_move.movec = local_690.movec;
        hash_move._10_2_ = local_690._10_2_;
        all_movements = local_638;
        local_680 = (ulong)(uint)depth;
        local_640 = inspire;
        MoveSort(situation,&local_64c,all_movements,hash_move,step);
        if (0 < local_64c) {
          local_694 = -0x100000;
          local_684 = (int)local_680 + -1;
          local_66c = -beta;
          local_670 = (uint)CONCAT71((uint7)(uint3)((uint)local_66c >> 8),1);
          lVar11 = 0;
          local_648 = 0;
          local_698 = alpha;
          do {
            uVar1 = all_movements->from;
            uVar2 = all_movements->to;
            uVar3 = all_movements->capture;
            uVar5 = all_movements->field_0x3;
            uVar7 = all_movements->value;
            uVar6 = CONCAT41(uVar7,uVar5);
            uVar4 = CONCAT51(uVar6,uVar3);
            local_690.catc = all_movements->catc;
            local_690.movec = all_movements->movec;
            local_690._10_2_ = *(undefined2 *)&all_movements->field_0xa;
            local_690.from = uVar1;
            local_690.to = uVar2;
            local_690._2_6_ = uVar4;
            if (uVar1 != '\0' || uVar2 != '\0') {
              bVar8 = MakeAMove(situation,&local_690,false);
              situation = local_678;
              if (bVar8) {
                iVar12 = step + -10000;
              }
              else {
                if ((local_648 & 1) != 0) {
                  iVar9 = SearchCut(local_678,local_684,-local_698,false);
                  iVar12 = -iVar9;
                  if (beta <= iVar12 || SBORROW4(local_698,iVar12) == local_698 + iVar9 < 0)
                  goto LAB_0010a8a6;
                }
                iVar12 = PVSearch(situation,local_684,local_66c,-local_698,&local_668);
                iVar12 = -iVar12;
              }
LAB_0010a8a6:
              UnMakeAMove(situation);
              if (beta <= iVar12) {
                iVar9 = (int)local_680;
                SetBestMove(&local_690,step,iVar9);
                move_01.to = local_690.to;
                move_01.from = local_690.from;
                move_01.capture = local_690.capture;
                move_01._3_1_ = local_690._3_1_;
                move_01.value = local_690.value;
                move_01.catc = local_690.catc;
                move_01.movec = local_690.movec;
                move_01._10_2_ = local_690._10_2_;
                SaveHashTable(iVar9,beta,'\x02',move_01);
                return beta;
              }
              if (local_694 < iVar12) {
                local_658.catc = local_690.catc;
                local_658.movec = local_690.movec;
                local_658._10_2_ = local_690._10_2_;
                local_658.to = local_690.to;
                local_658.from = local_690.from;
                local_658.capture = local_690.capture;
                local_658._3_1_ = local_690._3_1_;
                local_658.value = local_690.value;
                local_640->catc = local_690.catc;
                local_640->movec = local_690.movec;
                *(undefined2 *)&local_640->field_0xa = local_690._10_2_;
                local_640->from = local_690.from;
                local_640->to = local_690.to;
                local_640->capture = local_690.capture;
                local_640->field_0x3 = local_690._3_1_;
                local_640->value = local_690.value;
                local_694 = iVar12;
                if (local_698 < iVar12) {
                  local_648 = CONCAT71((uint7)local_690._9_3_,1);
                  local_670 = 0;
                  local_698 = iVar12;
                }
              }
            }
            lVar11 = lVar11 + 1;
            all_movements = all_movements + 1;
          } while (lVar11 < local_64c);
          alpha = local_698;
          if ((local_670 & 1) == 0) {
            iVar9 = (int)local_680;
            SetBestMove(&local_658,step,iVar9);
            move_03.catc = local_658.catc;
            move_03.movec = local_658.movec;
            move_03._10_2_ = local_658._10_2_;
            move_03.from = local_658.from;
            move_03.to = local_658.to;
            move_03.capture = local_658.capture;
            move_03._3_1_ = local_658._3_1_;
            move_03.value = local_658.value;
            SaveHashTable(iVar9,local_694,'\0',move_03);
            return local_698;
          }
        }
        move_02.catc = local_658.catc;
        move_02.movec = local_658.movec;
        move_02._10_2_ = local_658._10_2_;
        move_02.from = local_658.from;
        move_02.to = local_658.to;
        move_02.capture = local_658.capture;
        move_02._3_1_ = local_658._3_1_;
        move_02.value = local_658.value;
        SaveHashTable((int)local_680,alpha,'\x01',move_02);
        iVar9 = alpha;
      }
      else {
        isTimeLimit = true;
        iVar9 = 0x100000;
      }
    }
  }
  return iVar9;
}

Assistant:

int PVSearch(Situation& situation, int depth, int alpha, int beta, Movement& inspire){
    int value;                      // 下一着法的分值
    int best;                       // 所有着法中的最佳分值
    Movement move_list[128];        // 当前所有着法
    Movement move;                  // 当前着法
    Movement good_move;             // 当前局面最佳着法
    Movement inspire_move;          // 内部迭代启发着法
    move = good_move = inspire_move = NONE_MOVE;

    // 到达搜索深度
    if(depth <= 0){
        // 静态搜索评估
        return QuiescentSearch(situation, alpha, beta);
    }

    if(step - MAX_VALUE >= beta)
        return beta;

    // 置换表裁剪
    value = ReadHashTable(depth, alpha, beta, move);
    if(value != NONE_VALUE && value > -MAX_VALUE){
        return value;
    }

    // 内部迭代加深启发(在置换表未能给出启发走法时使用)
    if(depth > 2 && !MovementsLegal(move, situation)){
        value = PVSearch(situation, depth / 2, alpha, beta, inspire_move);
        if(value <= alpha){
            value = PVSearch(situation, depth / 2, -NONE_VALUE, beta, inspire_move);
        }
        move = inspire_move;
    }

    // 时间检测，避免超限
    if(isTimeLimit || clock() - StartTime > MAX_TIME){
        isTimeLimit = 1;
        return NONE_VALUE;
    }
    
    best = -NONE_VALUE;
    bool isAlpha = true;    // 当前结点是否为Alpha结点
    bool PVflag = false;

    int move_num = 0;       // 着法数量
    // 生成着法
    MoveSort(situation, move_num, move_list, move, step);
    for(int i = 0; i < move_num; i++){
        move = move_list[i];
        if(move.from == 0 && move.to == 0) continue;
        // 下子
        if(MakeAMove(situation, move)){
            value = -MAX_VALUE + step;
        }
        else{
            if(PVflag){
                value = -SearchCut(situation, depth - 1, -alpha);
                if(value > alpha && value < beta)
                    value = -PVSearch(situation, depth - 1, -beta, -alpha, inspire_move);
            }
            else
                value = -PVSearch(situation, depth - 1, -beta, -alpha, inspire_move);
        }
        // 回溯
        UnMakeAMove(situation);

        // 当前为beta结点，执行剪枝
        if(value >= beta){
            // inspire = move;
            // 此着法是好着法，记录进历史表和杀手表
            SetBestMove(move, step, depth);
            SaveHashTable(depth, beta, hashBETA, move);
            return beta;
        }
        if(value > best){
            best = value;           // 更新最佳分数
            good_move = move;       // 更新最佳着法
            inspire = good_move;
            if(value > alpha){
                isAlpha = false;
                PVflag = true;
                alpha = value;
            }
        }
    }

    // 当前结点为alpha结点
    if(isAlpha){
        SaveHashTable(depth, alpha, hashALPHA, good_move);
    }
    // 当前结点为PV结点
    else{
        // 将PV结点中的最好着法，记录进历史表和杀手表
        SetBestMove(good_move, step, depth);
        SaveHashTable(depth, best, hashEXACT, good_move);
    }
    return alpha;
}